

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  char *pcVar1;
  InternalRunDeathTestFlag *pIVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  int *piVar9;
  void *__addr;
  ulong *puVar10;
  __sighandler_t p_Var11;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  _union_1457 _Var14;
  long lVar15;
  ulong uVar16;
  undefined8 uVar17;
  _union_1457 *p_Var18;
  const_iterator __position;
  size_t __len;
  int pipe_fd [2];
  int death_test_index;
  ExecDeathTestArgs args_2;
  Arguments args;
  string internal_flag;
  sigaction ignore_sigprof_action;
  string filter_flag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  ulong *local_310;
  long local_308;
  ulong local_300;
  long lStack_2f8;
  ulong *local_2f0;
  long local_2e8;
  ulong local_2e0;
  long lStack_2d8;
  ulong *local_2d0;
  long local_2c8;
  ulong local_2c0;
  long lStack_2b8;
  _union_1457 local_2b0;
  long local_2a8;
  _union_1457 local_2a0;
  long lStack_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280;
  string local_270;
  string local_250;
  int local_230;
  int local_22c;
  string local_228;
  int local_204;
  string local_200;
  string local_1e0;
  char *local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  string local_1a0;
  _union_1457 local_180;
  undefined1 local_178 [8];
  ulong local_170;
  ulong uStack_168;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  _union_1457 local_c8;
  long local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [8];
  
  UnitTest::GetInstance();
  pIVar2 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_).ptr_;
  local_204 = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar2 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar2->write_fd_;
    return EXECUTE_TEST;
  }
  iVar4 = pipe(&local_230);
  if (iVar4 == -1) {
    local_2f0 = &local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","");
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    local_310 = (ulong *)*puVar8;
    puVar10 = puVar8 + 2;
    if (local_310 == puVar10) {
      local_300 = *puVar10;
      lStack_2f8 = puVar8[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *puVar10;
    }
    local_308 = puVar8[1];
    *puVar8 = puVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
    local_2d0 = (ulong *)*puVar8;
    puVar10 = puVar8 + 2;
    if (local_2d0 == puVar10) {
      local_2c0 = *puVar10;
      lStack_2b8 = puVar8[3];
      local_2d0 = &local_2c0;
    }
    else {
      local_2c0 = *puVar10;
    }
    local_2c8 = puVar8[1];
    *puVar8 = puVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    local_250._M_dataplus._M_p._0_4_ = 0x46f;
    StreamableToString<int>((string *)&local_290,(int *)&local_250);
    uVar16 = 0xf;
    if (local_2d0 != &local_2c0) {
      uVar16 = local_2c0;
    }
    if (uVar16 < (ulong)(local_290._8_8_ + local_2c8)) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_allocated_capacity != &local_280) {
        uVar17 = local_280._M_allocated_capacity;
      }
      if ((ulong)uVar17 < (ulong)(local_290._8_8_ + local_2c8)) goto LAB_0021215c;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0);
    }
    else {
LAB_0021215c:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d0,local_290._M_allocated_capacity);
    }
    local_2b0.sa_handler = (__sighandler_t)*puVar8;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.sa_handler == paVar13) {
      local_2a0 = (_union_1457)paVar13->_M_allocated_capacity;
      lStack_298 = puVar8[3];
      local_2b0.sa_handler = (__sighandler_t)&local_2a0;
    }
    else {
      local_2a0 = (_union_1457)paVar13->_M_allocated_capacity;
    }
    local_2a8 = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    paVar13->_M_local_buf[0] = '\0';
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    local_180.sa_handler = (__sighandler_t)*puVar8;
    p_Var11 = (__sighandler_t)(puVar8 + 2);
    if (local_180.sa_handler == p_Var11) {
      local_170 = *(ulong *)p_Var11;
      uStack_168 = puVar8[3];
      local_180.sa_handler = (__sighandler_t)&local_170;
    }
    else {
      local_170 = *(ulong *)p_Var11;
    }
    local_178 = (undefined1  [8])puVar8[1];
    *puVar8 = p_Var11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
LAB_0021266e:
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
    local_c8.sa_handler = (__sighandler_t)*puVar8;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.sa_handler != paVar13) goto LAB_00211f2a;
    local_b8[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar8[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
    goto LAB_00211f35;
  }
  iVar4 = fcntl(local_22c,2,0);
  if (iVar4 == -1) {
    local_2f0 = &local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"CHECK failed: File ","");
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
    local_310 = (ulong *)*puVar8;
    puVar10 = puVar8 + 2;
    if (local_310 == puVar10) {
      local_300 = *puVar10;
      lStack_2f8 = puVar8[3];
      local_310 = &local_300;
    }
    else {
      local_300 = *puVar10;
    }
    local_308 = puVar8[1];
    *puVar8 = puVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
    local_2d0 = (ulong *)*puVar8;
    puVar10 = puVar8 + 2;
    if (local_2d0 == puVar10) {
      local_2c0 = *puVar10;
      lStack_2b8 = puVar8[3];
      local_2d0 = &local_2c0;
    }
    else {
      local_2c0 = *puVar10;
    }
    local_2c8 = puVar8[1];
    *puVar8 = puVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    local_250._M_dataplus._M_p._0_4_ = 0x472;
    StreamableToString<int>((string *)&local_290,(int *)&local_250);
    uVar16 = 0xf;
    if (local_2d0 != &local_2c0) {
      uVar16 = local_2c0;
    }
    if (uVar16 < (ulong)(local_290._8_8_ + local_2c8)) {
      uVar17 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_allocated_capacity != &local_280) {
        uVar17 = local_280._M_allocated_capacity;
      }
      if ((ulong)uVar17 < (ulong)(local_290._8_8_ + local_2c8)) goto LAB_00212256;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_290,0,(char *)0x0,(ulong)local_2d0);
    }
    else {
LAB_00212256:
      puVar8 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2d0,local_290._M_allocated_capacity);
    }
    local_2b0.sa_handler = (__sighandler_t)*puVar8;
    paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(puVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.sa_handler == paVar13) {
      local_2a0 = (_union_1457)paVar13->_M_allocated_capacity;
      lStack_298 = puVar8[3];
      local_2b0.sa_handler = (__sighandler_t)&local_2a0;
    }
    else {
      local_2a0 = (_union_1457)paVar13->_M_allocated_capacity;
    }
    local_2a8 = puVar8[1];
    *puVar8 = paVar13;
    puVar8[1] = 0;
    paVar13->_M_local_buf[0] = '\0';
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b0);
    local_180.sa_handler = (__sighandler_t)*puVar8;
    p_Var11 = (__sighandler_t)(puVar8 + 2);
    if (local_180.sa_handler == p_Var11) {
      local_170 = *(ulong *)p_Var11;
      uStack_168 = puVar8[3];
      local_180.sa_handler = (__sighandler_t)&local_170;
    }
    else {
      local_170 = *(ulong *)p_Var11;
    }
    local_178 = (undefined1  [8])puVar8[1];
    *puVar8 = p_Var11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    goto LAB_0021266e;
  }
  local_2f0 = &local_2e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"--","");
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_300 = *puVar10;
    lStack_2f8 = plVar7[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar10;
    local_310 = (ulong *)*plVar7;
  }
  local_308 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_310);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_2c0 = *puVar10;
    lStack_2b8 = plVar7[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *puVar10;
    local_2d0 = (ulong *)*plVar7;
  }
  local_2c8 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  p_Var18 = (_union_1457 *)(plVar7 + 2);
  if ((_union_1457 *)*plVar7 == p_Var18) {
    local_2a0 = *p_Var18;
    lStack_298 = plVar7[3];
    local_2b0.sa_handler = (__sighandler_t)&local_2a0;
  }
  else {
    local_2a0 = *p_Var18;
    local_2b0.sa_handler = (__sighandler_t)*plVar7;
  }
  local_2a8 = plVar7[1];
  *plVar7 = (long)p_Var18;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  local_180.sa_handler = (__sighandler_t)&local_170;
  p_Var11 = (__sighandler_t)(plVar7 + 2);
  if ((__sighandler_t)*plVar7 == p_Var11) {
    local_170 = *(ulong *)p_Var11;
    uStack_168 = plVar7[3];
  }
  else {
    local_170 = *(ulong *)p_Var11;
    local_180.sa_handler = (__sighandler_t)*plVar7;
  }
  local_178 = (undefined1  [8])plVar7[1];
  *plVar7 = (long)p_Var11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 == paVar13) {
    local_b8[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar8[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
    local_b8[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_c8.sa_handler = (__sighandler_t)*puVar8;
  }
  local_c0 = puVar8[1];
  *puVar8 = paVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_c8);
  local_e8 = &local_d8;
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_d8 = *plVar12;
    lStack_d0 = plVar7[3];
  }
  else {
    local_d8 = *plVar12;
    local_e8 = (long *)*plVar7;
  }
  local_e0 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler);
  }
  if (local_180.sa_handler != (__sighandler_t)&local_170) {
    operator_delete(local_180.sa_handler);
  }
  if ((_union_1457 *)local_2b0.sa_handler != &local_2a0) {
    operator_delete(local_2b0.sa_handler);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0);
  }
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"--","");
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_228);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  puVar10 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_270.field_2._M_allocated_capacity = *puVar10;
    local_270.field_2._8_8_ = plVar7[3];
  }
  else {
    local_270.field_2._M_allocated_capacity = *puVar10;
    local_270._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_270._M_string_length = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_270);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  puVar10 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_250.field_2._M_allocated_capacity = *puVar10;
    local_250.field_2._8_8_ = plVar7[3];
  }
  else {
    local_250.field_2._M_allocated_capacity = *puVar10;
    local_250._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_250._M_string_length = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_250);
  local_290._M_allocated_capacity = (size_type)&local_280;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 == paVar13) {
    local_280._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_280._8_8_ = plVar7[3];
  }
  else {
    local_280._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_290._M_allocated_capacity =
         (size_type)
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar7;
  }
  local_290._8_8_ = plVar7[1];
  *plVar7 = (long)paVar13;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_290._M_local_buf);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_2e0 = *puVar10;
    lStack_2d8 = plVar7[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar10;
    local_2f0 = (ulong *)*plVar7;
  }
  local_2e8 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f0);
  puVar10 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar10) {
    local_300 = *puVar10;
    lStack_2f8 = plVar7[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar10;
    local_310 = (ulong *)*plVar7;
  }
  local_308 = plVar7[1];
  *plVar7 = (long)puVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  StreamableToString<int>(&local_1e0,&this->line_);
  uVar16 = 0xf;
  if (local_310 != &local_300) {
    uVar16 = local_300;
  }
  if (uVar16 < local_1e0._M_string_length + local_308) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      uVar17 = local_1e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_1e0._M_string_length + local_308) goto LAB_00211023;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1e0,0,(char *)0x0,(ulong)local_310);
  }
  else {
LAB_00211023:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_1e0._M_dataplus._M_p);
  }
  puVar10 = puVar8 + 2;
  if ((ulong *)*puVar8 == puVar10) {
    local_2c0 = *puVar10;
    lStack_2b8 = puVar8[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *puVar10;
    local_2d0 = (ulong *)*puVar8;
  }
  local_2c8 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)puVar10 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  p_Var18 = (_union_1457 *)(plVar7 + 2);
  if ((_union_1457 *)*plVar7 == p_Var18) {
    local_2a0.sa_handler = p_Var18->sa_handler;
    lStack_298 = plVar7[3];
    local_2b0.sa_handler = (__sighandler_t)&local_2a0;
  }
  else {
    local_2a0.sa_handler = p_Var18->sa_handler;
    local_2b0.sa_handler = (__sighandler_t)*plVar7;
  }
  local_2a8 = plVar7[1];
  *plVar7 = (long)p_Var18;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  StreamableToString<int>(&local_200,&local_204);
  p_Var11 = (__sighandler_t)
            (CONCAT44(local_200._M_string_length._4_4_,(int)local_200._M_string_length) + local_2a8)
  ;
  _Var14 = (_union_1457)0xf;
  if ((_union_1457 *)local_2b0.sa_handler != &local_2a0) {
    _Var14 = local_2a0;
  }
  if ((ulong)_Var14 < p_Var11) {
    uVar17 = (__sighandler_t)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      uVar17 = local_200.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < p_Var11) goto LAB_00211141;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_200,0,(char *)0x0,(ulong)local_2b0);
  }
  else {
LAB_00211141:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_2b0,(ulong)local_200._M_dataplus._M_p);
  }
  local_180.sa_handler = (__sighandler_t)&local_170;
  p_Var11 = (__sighandler_t)(puVar8 + 2);
  if ((__sighandler_t)*puVar8 == p_Var11) {
    local_170 = *(ulong *)p_Var11;
    uStack_168 = puVar8[3];
  }
  else {
    local_170 = *(ulong *)p_Var11;
    local_180.sa_handler = (__sighandler_t)*puVar8;
  }
  local_178 = (undefined1  [8])puVar8[1];
  *puVar8 = p_Var11;
  puVar8[1] = 0;
  *p_Var11 = (__sighandler_t)0x0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 == paVar13) {
    local_b8[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar8[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
    local_b8[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_c8.sa_handler = (__sighandler_t)*puVar8;
  }
  local_c0 = puVar8[1];
  *puVar8 = paVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  StreamableToString<int>(&local_1a0,&local_22c);
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    uVar17 = local_b8[0]._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_c0 + local_1a0._M_string_length) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
        &local_1a0.field_2) {
      uVar17 = local_1a0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_c0 + local_1a0._M_string_length) goto LAB_00211293;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1a0,0,(char *)0x0,(ulong)local_c8);
  }
  else {
LAB_00211293:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_c8,
                        CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_))
    ;
  }
  local_1c0 = (char *)&local_1b0;
  pcVar1 = (char *)(puVar8 + 2);
  if ((char *)*puVar8 == pcVar1) {
    local_1b0 = *(undefined8 *)pcVar1;
    uStack_1a8 = puVar8[3];
  }
  else {
    local_1b0 = *(undefined8 *)pcVar1;
    local_1c0 = (char *)*puVar8;
  }
  local_1b8 = puVar8[1];
  *puVar8 = pcVar1;
  puVar8[1] = 0;
  *pcVar1 = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_) !=
      &local_1a0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_1a0._M_dataplus._M_p._4_4_,local_1a0._M_dataplus._M_p._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler);
  }
  if (local_180.sa_handler != (__sighandler_t)&local_170) {
    operator_delete(local_180.sa_handler);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if ((_union_1457 *)local_2b0.sa_handler != &local_2a0) {
    operator_delete(local_2b0.sa_handler);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_allocated_capacity != &local_280) {
    operator_delete((void *)local_290._M_allocated_capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  Arguments::Arguments((Arguments *)&local_1e0);
  GetInjectableArgvs_abi_cxx11_();
  Arguments::AddArguments<std::__cxx11::string>
            ((Arguments *)&local_1e0,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_c8);
  __position._M_current = (char **)(local_1e0._M_string_length - 8);
  local_c8.sa_handler = (__sighandler_t)strdup((char *)local_e8);
  std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
            ((vector<char_*,_std::allocator<char_*>_> *)&local_1e0,__position,
             (value_type *)&local_c8.sa_handler);
  local_c8.sa_handler = (__sighandler_t)strdup(local_1c0);
  std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
            ((vector<char_*,_std::allocator<char_*>_> *)&local_1e0,
             (char **)(local_1e0._M_string_length - 8),(value_type *)&local_c8.sa_handler);
  local_c8.sa_handler = (__sighandler_t)local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"");
  std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler != local_b8) {
    operator_delete(local_c8.sa_handler);
  }
  CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
  fflush((FILE *)0x0);
  local_200._M_dataplus._M_p = local_1e0._M_dataplus._M_p;
  local_200._M_string_length._0_4_ = local_230;
  memset(&local_180,0,0x98);
  sigemptyset((sigset_t *)local_178);
  local_180 = (_union_1457)0x1;
  do {
    iVar4 = sigaction(0x1b,(sigaction *)&local_180,(sigaction *)&local_c8);
    cVar3 = FLAGS_gtest_death_test_use_fork;
    if (iVar4 != -1) {
      iVar4 = -1;
      if (FLAGS_gtest_death_test_use_fork == '\0') {
        if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
          AssumeRole();
        }
        uVar5 = getpagesize();
        __len = (size_t)(int)uVar5;
        __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
        if (__addr == (void *)0xffffffffffffffff) {
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_250,"CHECK failed: File ","");
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
          local_290._M_allocated_capacity = *puVar8;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_allocated_capacity == paVar13) {
            local_280._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_280._8_8_ = puVar8[3];
            local_290._M_allocated_capacity = (size_type)&local_280;
          }
          else {
            local_280._M_allocated_capacity = paVar13->_M_allocated_capacity;
          }
          local_290._8_8_ = puVar8[1];
          *puVar8 = paVar13;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append(local_290._M_local_buf);
          local_2f0 = (ulong *)*puVar8;
          puVar10 = puVar8 + 2;
          if (local_2f0 == puVar10) {
            local_2e0 = *puVar10;
            lStack_2d8 = puVar8[3];
            local_2f0 = &local_2e0;
          }
          else {
            local_2e0 = *puVar10;
          }
          local_2e8 = puVar8[1];
          *puVar8 = puVar10;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          local_228._M_dataplus._M_p._0_4_ = 0x439;
          StreamableToString<int>(&local_270,(int *)&local_228);
          uVar16 = 0xf;
          if (local_2f0 != &local_2e0) {
            uVar16 = local_2e0;
          }
          if (uVar16 < local_270._M_string_length + local_2e8) {
            uVar17 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
              uVar17 = local_270.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar17 < local_270._M_string_length + local_2e8) goto LAB_002127a0;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0)
            ;
          }
          else {
LAB_002127a0:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
          }
          local_310 = (ulong *)*puVar8;
          puVar10 = puVar8 + 2;
          if (local_310 == puVar10) {
            local_300 = *puVar10;
            lStack_2f8 = puVar8[3];
            local_310 = &local_300;
          }
          else {
            local_300 = *puVar10;
          }
          local_308 = puVar8[1];
          *puVar8 = puVar10;
          puVar8[1] = 0;
          *(undefined1 *)puVar10 = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
          local_2d0 = (ulong *)*puVar8;
          puVar10 = puVar8 + 2;
          if (local_2d0 == puVar10) {
            local_2c0 = *puVar10;
            lStack_2b8 = puVar8[3];
            local_2d0 = &local_2c0;
          }
          else {
            local_2c0 = *puVar10;
          }
          local_2c8 = puVar8[1];
          *puVar8 = puVar10;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
        }
        else {
          lVar15 = 0;
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
            lVar15 = __len - 0x40;
          }
          if ((0x40 < uVar5) && (((ulong)(lVar15 + (long)__addr) & 0x3f) == 0)) {
            iVar4 = clone(ExecDeathTestChildMain,(void *)(lVar15 + (long)__addr),0x11,&local_200);
            iVar6 = munmap(__addr,__len);
            if (iVar6 != -1) goto LAB_0021169b;
            goto LAB_00212360;
          }
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_250,"CHECK failed: File ","");
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
          local_290._M_allocated_capacity = *puVar8;
          paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar8 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_allocated_capacity == paVar13) {
            local_280._M_allocated_capacity = paVar13->_M_allocated_capacity;
            local_280._8_8_ = puVar8[3];
            local_290._M_allocated_capacity = (size_type)&local_280;
          }
          else {
            local_280._M_allocated_capacity = paVar13->_M_allocated_capacity;
          }
          local_290._8_8_ = puVar8[1];
          *puVar8 = paVar13;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append(local_290._M_local_buf);
          local_2f0 = (ulong *)*puVar8;
          puVar10 = puVar8 + 2;
          if (local_2f0 == puVar10) {
            local_2e0 = *puVar10;
            lStack_2d8 = puVar8[3];
            local_2f0 = &local_2e0;
          }
          else {
            local_2e0 = *puVar10;
          }
          local_2e8 = puVar8[1];
          *puVar8 = puVar10;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          local_228._M_dataplus._M_p._0_4_ = 0x446;
          StreamableToString<int>(&local_270,(int *)&local_228);
          uVar16 = 0xf;
          if (local_2f0 != &local_2e0) {
            uVar16 = local_2e0;
          }
          if (uVar16 < local_270._M_string_length + local_2e8) {
            uVar17 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270._M_dataplus._M_p != &local_270.field_2) {
              uVar17 = local_270.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar17 < local_270._M_string_length + local_2e8) goto LAB_002128b1;
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0)
            ;
          }
          else {
LAB_002128b1:
            puVar8 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
          }
          local_310 = (ulong *)*puVar8;
          puVar10 = puVar8 + 2;
          if (local_310 == puVar10) {
            local_300 = *puVar10;
            lStack_2f8 = puVar8[3];
            local_310 = &local_300;
          }
          else {
            local_300 = *puVar10;
          }
          local_308 = puVar8[1];
          *puVar8 = puVar10;
          puVar8[1] = 0;
          *(undefined1 *)puVar10 = 0;
          puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
          local_2d0 = (ulong *)*puVar8;
          puVar10 = puVar8 + 2;
          if (local_2d0 == puVar10) {
            local_2c0 = *puVar10;
            lStack_2b8 = puVar8[3];
            local_2d0 = &local_2c0;
          }
          else {
            local_2c0 = *puVar10;
          }
          local_2c8 = puVar8[1];
          *puVar8 = puVar10;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
        }
      }
      else {
LAB_0021169b:
        if ((cVar3 == '\0') || (iVar4 = fork(), iVar4 != 0)) {
          goto LAB_002116b7;
        }
        ExecDeathTestChildMain(&local_200);
LAB_00212360:
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_250,"CHECK failed: File ","");
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
        local_290._M_allocated_capacity = *puVar8;
        paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_allocated_capacity == paVar13) {
          local_280._M_allocated_capacity = paVar13->_M_allocated_capacity;
          local_280._8_8_ = puVar8[3];
          local_290._M_allocated_capacity = (size_type)&local_280;
        }
        else {
          local_280._M_allocated_capacity = paVar13->_M_allocated_capacity;
        }
        local_290._8_8_ = puVar8[1];
        *puVar8 = paVar13;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append(local_290._M_local_buf);
        local_2f0 = (ulong *)*puVar8;
        puVar10 = puVar8 + 2;
        if (local_2f0 == puVar10) {
          local_2e0 = *puVar10;
          lStack_2d8 = puVar8[3];
          local_2f0 = &local_2e0;
        }
        else {
          local_2e0 = *puVar10;
        }
        local_2e8 = puVar8[1];
        *puVar8 = puVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
        local_228._M_dataplus._M_p._0_4_ = 0x44a;
        StreamableToString<int>(&local_270,(int *)&local_228);
        uVar16 = 0xf;
        if (local_2f0 != &local_2e0) {
          uVar16 = local_2e0;
        }
        if (uVar16 < local_270._M_string_length + local_2e8) {
          uVar17 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            uVar17 = local_270.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar17 < local_270._M_string_length + local_2e8) goto LAB_002129c2;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0);
        }
        else {
LAB_002129c2:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
        }
        local_310 = (ulong *)*puVar8;
        puVar10 = puVar8 + 2;
        if (local_310 == puVar10) {
          local_300 = *puVar10;
          lStack_2f8 = puVar8[3];
          local_310 = &local_300;
        }
        else {
          local_300 = *puVar10;
        }
        local_308 = puVar8[1];
        *puVar8 = puVar10;
        puVar8[1] = 0;
        *(undefined1 *)puVar10 = 0;
        puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
        local_2d0 = (ulong *)*puVar8;
        puVar10 = puVar8 + 2;
        if (local_2d0 == puVar10) {
          local_2c0 = *puVar10;
          lStack_2b8 = puVar8[3];
          local_2d0 = &local_2c0;
        }
        else {
          local_2c0 = *puVar10;
        }
        local_2c8 = puVar8[1];
        *puVar8 = puVar10;
        puVar8[1] = 0;
        *(undefined1 *)(puVar8 + 2) = 0;
      }
      goto LAB_00211d84;
    }
    piVar9 = __errno_location();
  } while (*piVar9 == 4);
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","");
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
  local_250._M_dataplus._M_p = (pointer)*puVar8;
  puVar10 = puVar8 + 2;
  if ((ulong *)local_250._M_dataplus._M_p == puVar10) {
    local_250.field_2._M_allocated_capacity = *puVar10;
    local_250.field_2._8_8_ = puVar8[3];
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  }
  else {
    local_250.field_2._M_allocated_capacity = *puVar10;
  }
  local_250._M_string_length = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
  local_290._M_allocated_capacity = *puVar8;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_allocated_capacity == paVar13) {
    local_280._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_280._8_8_ = puVar8[3];
    local_290._M_allocated_capacity = (size_type)&local_280;
  }
  else {
    local_280._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_290._8_8_ = puVar8[1];
  *puVar8 = paVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_1a0._M_dataplus._M_p._0_4_ = 0x42d;
  StreamableToString<int>(&local_228,(int *)&local_1a0);
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_allocated_capacity != &local_280) {
    uVar17 = local_280._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_228._M_string_length + local_290._8_8_) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      uVar17 = local_228.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_228._M_string_length + local_290._8_8_) goto LAB_00211946;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_228,0,(char *)0x0,local_290._M_allocated_capacity);
  }
  else {
LAB_00211946:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append
                       (local_290._M_local_buf,(ulong)local_228._M_dataplus._M_p);
  }
  local_2f0 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_2f0 == puVar10) {
    local_2e0 = *puVar10;
    lStack_2d8 = puVar8[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar10;
  }
  local_2e8 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)puVar10 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_310 == puVar10) {
    local_300 = *puVar10;
    lStack_2f8 = puVar8[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar10;
  }
  local_308 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  goto LAB_00211d29;
LAB_0021174c:
  do {
    iVar6 = close(local_22c);
    if (iVar6 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = iVar4;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_230;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)&local_1e0);
      if (local_1c0 != (char *)&local_1b0) {
        operator_delete(local_1c0);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8);
      }
      return OVERSEE_TEST;
    }
    piVar9 = __errno_location();
  } while (*piVar9 == 4);
  local_290._M_allocated_capacity = (size_type)&local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"CHECK failed: File ","");
  puVar8 = (undefined8 *)std::__cxx11::string::append(local_290._M_local_buf);
  local_2f0 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_2f0 == puVar10) {
    local_2e0 = *puVar10;
    lStack_2d8 = puVar8[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar10;
  }
  local_2e8 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_310 == puVar10) {
    local_300 = *puVar10;
    lStack_2f8 = puVar8[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar10;
  }
  local_308 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_270._M_dataplus._M_p._0_4_ = 0x489;
  StreamableToString<int>(&local_250,(int *)&local_270);
  uVar16 = 0xf;
  if (local_310 != &local_300) {
    uVar16 = local_300;
  }
  if (uVar16 < local_250._M_string_length + local_308) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != &local_250.field_2) {
      uVar17 = local_250.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_250._M_string_length + local_308) goto LAB_00211b83;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_310);
  }
  else {
LAB_00211b83:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_310,(ulong)local_250._M_dataplus._M_p);
  }
  local_2d0 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_2d0 == puVar10) {
    local_2c0 = *puVar10;
    lStack_2b8 = puVar8[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *puVar10;
  }
  local_2c8 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)puVar10 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0.sa_handler = (__sighandler_t)*puVar8;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0.sa_handler == paVar13) {
    local_2a0 = (_union_1457)paVar13->_M_allocated_capacity;
    lStack_298 = puVar8[3];
    local_2b0.sa_handler = (__sighandler_t)&local_2a0;
  }
  else {
    local_2a0 = (_union_1457)paVar13->_M_allocated_capacity;
  }
  local_2a8 = puVar8[1];
  *puVar8 = paVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  local_180.sa_handler = (__sighandler_t)*plVar7;
  p_Var11 = (__sighandler_t)(plVar7 + 2);
  if (local_180.sa_handler == p_Var11) {
    local_170 = *(ulong *)p_Var11;
    uStack_168 = plVar7[3];
    local_180.sa_handler = (__sighandler_t)&local_170;
  }
  else {
    local_170 = *(ulong *)p_Var11;
  }
  local_178 = (undefined1  [8])plVar7[1];
  *plVar7 = (long)p_Var11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_180);
  local_c8.sa_handler = (__sighandler_t)*puVar8;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.sa_handler == paVar13) {
    local_b8[0]._0_8_ = paVar13->_M_allocated_capacity;
    local_b8[0]._8_8_ = puVar8[3];
    local_c8.sa_handler = (__sighandler_t)local_b8;
  }
  else {
LAB_00211f2a:
    local_b8[0]._0_8_ = paVar13->_M_allocated_capacity;
  }
LAB_00211f35:
  _Var14 = *(_union_1457 *)(puVar8 + 1);
  p_Var18 = &local_c8;
  goto LAB_00211f41;
  while (piVar9 = __errno_location(), *piVar9 == 4) {
LAB_002116b7:
    iVar6 = sigaction(0x1b,(sigaction *)&local_c8,(sigaction *)0x0);
    if (iVar6 != -1) {
      if (iVar4 != -1) goto LAB_0021174c;
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"CHECK failed: File ","")
      ;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
      local_290._M_allocated_capacity = *puVar8;
      paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_allocated_capacity == paVar13) {
        local_280._M_allocated_capacity = paVar13->_M_allocated_capacity;
        local_280._8_8_ = puVar8[3];
        local_290._M_allocated_capacity = (size_type)&local_280;
      }
      else {
        local_280._M_allocated_capacity = paVar13->_M_allocated_capacity;
      }
      local_290._8_8_ = puVar8[1];
      *puVar8 = paVar13;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append(local_290._M_local_buf);
      local_2f0 = (ulong *)*puVar8;
      puVar10 = puVar8 + 2;
      if (local_2f0 == puVar10) {
        local_2e0 = *puVar10;
        lStack_2d8 = puVar8[3];
        local_2f0 = &local_2e0;
      }
      else {
        local_2e0 = *puVar10;
      }
      local_2e8 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      local_228._M_dataplus._M_p._0_4_ = 0x45a;
      StreamableToString<int>(&local_270,(int *)&local_228);
      uVar16 = 0xf;
      if (local_2f0 != &local_2e0) {
        uVar16 = local_2e0;
      }
      if (uVar16 < local_270._M_string_length + local_2e8) {
        uVar17 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          uVar17 = local_270.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < local_270._M_string_length + local_2e8) goto LAB_002124c8;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_270,0,(char *)0x0,(ulong)local_2f0);
      }
      else {
LAB_002124c8:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2f0,(ulong)local_270._M_dataplus._M_p);
      }
      local_310 = (ulong *)*puVar8;
      puVar10 = puVar8 + 2;
      if (local_310 == puVar10) {
        local_300 = *puVar10;
        lStack_2f8 = puVar8[3];
        local_310 = &local_300;
      }
      else {
        local_300 = *puVar10;
      }
      local_308 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)puVar10 = 0;
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
      local_2d0 = (ulong *)*puVar8;
      puVar10 = puVar8 + 2;
      if (local_2d0 == puVar10) {
        local_2c0 = *puVar10;
        lStack_2b8 = puVar8[3];
        local_2d0 = &local_2c0;
      }
      else {
        local_2c0 = *puVar10;
      }
      local_2c8 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      goto LAB_00211d84;
    }
  }
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"CHECK failed: File ","");
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_270);
  local_250._M_dataplus._M_p = (pointer)*puVar8;
  puVar10 = puVar8 + 2;
  if ((ulong *)local_250._M_dataplus._M_p == puVar10) {
    local_250.field_2._M_allocated_capacity = *puVar10;
    local_250.field_2._8_8_ = puVar8[3];
    local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  }
  else {
    local_250.field_2._M_allocated_capacity = *puVar10;
  }
  local_250._M_string_length = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
  local_290._M_allocated_capacity = *puVar8;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_allocated_capacity == paVar13) {
    local_280._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_280._8_8_ = puVar8[3];
    local_290._M_allocated_capacity = (size_type)&local_280;
  }
  else {
    local_280._M_allocated_capacity = paVar13->_M_allocated_capacity;
  }
  local_290._8_8_ = puVar8[1];
  *puVar8 = paVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  local_1a0._M_dataplus._M_p._0_4_ = 0x457;
  StreamableToString<int>(&local_228,(int *)&local_1a0);
  uVar17 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_allocated_capacity != &local_280) {
    uVar17 = local_280._M_allocated_capacity;
  }
  if ((ulong)uVar17 < local_228._M_string_length + local_290._8_8_) {
    uVar17 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      uVar17 = local_228.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar17 < local_228._M_string_length + local_290._8_8_) goto LAB_00211a78;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_228,0,(char *)0x0,local_290._M_allocated_capacity);
  }
  else {
LAB_00211a78:
    puVar8 = (undefined8 *)
             std::__cxx11::string::_M_append
                       (local_290._M_local_buf,(ulong)local_228._M_dataplus._M_p);
  }
  local_2f0 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_2f0 == puVar10) {
    local_2e0 = *puVar10;
    lStack_2d8 = puVar8[3];
    local_2f0 = &local_2e0;
  }
  else {
    local_2e0 = *puVar10;
  }
  local_2e8 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)puVar10 = 0;
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2f0);
  local_310 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_310 == puVar10) {
    local_300 = *puVar10;
    lStack_2f8 = puVar8[3];
    local_310 = &local_300;
  }
  else {
    local_300 = *puVar10;
  }
  local_308 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
LAB_00211d29:
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  local_2d0 = (ulong *)*puVar8;
  puVar10 = puVar8 + 2;
  if (local_2d0 == puVar10) {
    local_2c0 = *puVar10;
    lStack_2b8 = puVar8[3];
    local_2d0 = &local_2c0;
  }
  else {
    local_2c0 = *puVar10;
  }
  local_2c8 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
LAB_00211d84:
  puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_2d0);
  local_2b0.sa_handler = (__sighandler_t)*puVar8;
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0.sa_handler == paVar13) {
    local_2a0 = (_union_1457)paVar13->_M_allocated_capacity;
    lStack_298 = puVar8[3];
    local_2b0.sa_handler = (__sighandler_t)&local_2a0;
  }
  else {
    local_2a0 = (_union_1457)paVar13->_M_allocated_capacity;
  }
  _Var14 = *(_union_1457 *)(puVar8 + 1);
  p_Var18 = &local_2b0;
LAB_00211f41:
  p_Var18[1] = _Var14;
  *puVar8 = paVar13;
  puVar8[1] = 0;
  *(undefined1 *)(puVar8 + 2) = 0;
  DeathTestAbort((string *)p_Var18);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != NULL) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kFilterFlag + "="
      + info->test_case_name() + "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}